

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::OneofCaseConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  LogMessage *other;
  string *input;
  undefined1 local_88 [8];
  string field_name;
  LogMessage local_50;
  cpp *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  pOVar1 = FieldDescriptor::containing_oneof((FieldDescriptor *)this);
  if (pOVar1 == (OneofDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x1c9);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: field->containing_oneof(): ");
    internal::LogFinisher::operator=((LogFinisher *)(field_name.field_2._M_local_buf + 0xb),other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  input = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)local_18);
  UnderscoresToCamelCase((string *)local_88,input,true);
  std::operator+(__return_storage_ptr__,"k",(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string OneofCaseConstantName(const FieldDescriptor* field) {
  GOOGLE_DCHECK(field->containing_oneof());
  std::string field_name = UnderscoresToCamelCase(field->name(), true);
  return "k" + field_name;
}